

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

CScriptNum * __thiscall CScriptNum::operator+=(CScriptNum *this,int64_t *rhs)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long *in_RSI;
  CScriptNum *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = true;
  if (*in_RSI != 0) {
    if (0 < *in_RSI) {
      lVar2 = in_RDI->m_value;
      lVar4 = std::numeric_limits<long>::max();
      bVar3 = true;
      if (lVar2 <= lVar4 - *in_RSI) goto LAB_003f5728;
    }
    bVar3 = false;
    if (*in_RSI < 0) {
      lVar2 = in_RDI->m_value;
      lVar4 = std::numeric_limits<long>::min();
      bVar3 = lVar4 - *in_RSI <= lVar2;
    }
  }
LAB_003f5728:
  if (!bVar3) {
    __assert_fail("rhs == 0 || (rhs > 0 && m_value <= std::numeric_limits<int64_t>::max() - rhs) || (rhs < 0 && m_value >= std::numeric_limits<int64_t>::min() - rhs)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/script.h"
                  ,0x13a,"CScriptNum &CScriptNum::operator+=(const int64_t &)");
  }
  in_RDI->m_value = in_RDI->m_value + *in_RSI;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline CScriptNum& operator+=( const int64_t& rhs)
    {
        assert(rhs == 0 || (rhs > 0 && m_value <= std::numeric_limits<int64_t>::max() - rhs) ||
                           (rhs < 0 && m_value >= std::numeric_limits<int64_t>::min() - rhs));
        m_value += rhs;
        return *this;
    }